

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O2

gme_err_t gme_identify_file(char *path,gme_type_t *type_out)

{
  bool bVar1;
  int iVar2;
  gme_type_t pgVar3;
  undefined4 extraout_var;
  gme_err_t pcVar4;
  char *extension_;
  size_t in_RCX;
  int __oflag;
  char header [4];
  Std_File_Reader in;
  
  pgVar3 = gme_identify_extension(path);
  *type_out = pgVar3;
  if (pgVar3 == (gme_type_t)0x0) {
    Std_File_Reader::Std_File_Reader(&in);
    iVar2 = Std_File_Reader::open(&in,path,__oflag);
    pcVar4 = (gme_err_t)CONCAT44(extraout_var,iVar2);
    if ((pcVar4 == (gme_err_t)0x0) &&
       (pcVar4 = (gme_err_t)Std_File_Reader::read(&in,(int)header,(void *)0x4,in_RCX),
       pcVar4 == (gme_err_t)0x0)) {
      extension_ = gme_identify_header(header);
      pgVar3 = gme_identify_extension(extension_);
      *type_out = pgVar3;
      bVar1 = true;
      pcVar4 = (gme_err_t)0x0;
    }
    else {
      bVar1 = false;
    }
    Std_File_Reader::~Std_File_Reader(&in);
    if (!bVar1) {
      return pcVar4;
    }
  }
  return (gme_err_t)0x0;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_identify_file( const char* path, gme_type_t* type_out )
{
	*type_out = gme_identify_extension( path );
	// TODO: don't examine header if file has extension?
	if ( !*type_out )
	{
		char header [4];
		GME_FILE_READER in;
		RETURN_ERR( in.open( path ) );
		RETURN_ERR( in.read( header, sizeof header ) );
		*type_out = gme_identify_extension( gme_identify_header( header ) );
	}
	return 0;   
}